

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

StringPtr __thiscall kj::trimSourceFilename(kj *this,StringPtr filename)

{
  size_t start;
  ArrayPtr<const_char> AVar1;
  bool bVar2;
  char cVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  StringPtr SVar6;
  Range<unsigned_long> *local_a0;
  char *local_98;
  ArrayPtr<const_char> local_90;
  undefined1 local_80 [8];
  StringPtr root;
  char **__end3;
  char **__begin3;
  char *(*__range3) [4];
  size_t i;
  Iterator __end1;
  Iterator __begin1;
  Range<unsigned_long> *__range1;
  StringPtr filename_local;
  
  filename_local.content.ptr = filename.content.ptr;
  __range1 = (Range<unsigned_long> *)this;
LAB_00229043:
  ___begin1 = indices<kj::StringPtr&>((StringPtr *)&__range1);
  __end1 = Range<unsigned_long>::begin((Range<unsigned_long> *)&__begin1);
  i = (size_t)Range<unsigned_long>::end((Range<unsigned_long> *)&__begin1);
  do {
    bVar2 = Range<unsigned_long>::Iterator::operator!=(&__end1,(Iterator *)&i);
    if (!bVar2) {
      AVar1.size_ = (size_t)filename_local.content.ptr;
      AVar1.ptr = (char *)__range1;
      return (StringPtr)AVar1;
    }
    puVar4 = Range<unsigned_long>::Iterator::operator*(&__end1);
    start = *puVar4;
    if ((start == 0) ||
       (cVar3 = StringPtr::operator[]((StringPtr *)&__range1,start - 1), cVar3 == '/')) {
      root.content.size_ = (size_t)&ExceptionCallback::vtable;
      for (__end3 = trimSourceFilename::ROOTS; __end3 != (char **)root.content.size_;
          __end3 = __end3 + 1) {
        StringPtr::StringPtr((StringPtr *)local_80,*__end3);
        local_90 = (ArrayPtr<const_char>)StringPtr::slice((StringPtr *)&__range1,start);
        bVar2 = StringPtr::startsWith((StringPtr *)&local_90,(StringPtr *)local_80);
        if (bVar2) {
          sVar5 = StringPtr::size((StringPtr *)local_80);
          SVar6 = StringPtr::slice((StringPtr *)&__range1,start + sVar5);
          local_a0 = (Range<unsigned_long> *)SVar6.content.ptr;
          __range1 = local_a0;
          local_98 = (char *)SVar6.content.size_;
          filename_local.content.ptr = local_98;
          goto LAB_00229043;
        }
      }
    }
    Range<unsigned_long>::Iterator::operator++(&__end1);
  } while( true );
}

Assistant:

kj::StringPtr trimSourceFilename(kj::StringPtr filename) {
  // Removes noisy prefixes from source code file name.
  //
  // The goal here is to produce the "canonical" filename given the filename returned by e.g.
  // addr2line. addr2line gives us the full path of the file as passed on the compiler
  // command-line, which in turn is affected by build system and by whether and where we're
  // performing an out-of-tree build.
  //
  // To deal with all this, we look for directory names in the path which we recognize to be
  // locations that represent roots of the source tree. We strip said root and everything before
  // it.
  //
  // On Windows, we often get filenames containing backslashes. Since we aren't allowed to allocate
  // a new string here, we can't do much about this, so our returned "canonical" name will
  // unfortunately end up with backslashes.

  static constexpr const char* ROOTS[] = {
    "ekam-provider/canonical/",  // Ekam source file.
    "ekam-provider/c++header/",  // Ekam include file.
    "src/",                      // Non-Ekam source root.
    "tmp/",                      // Non-Ekam generated code.
#if _WIN32
    "src\\",                     // Win32 source root.
    "tmp\\",                     // Win32 generated code.
#endif
  };

retry:
  for (size_t i: kj::indices(filename)) {
    if (i == 0 || filename[i-1] == '/'
#if _WIN32
               || filename[i-1] == '\\'
#endif
        ) {
      // We're at the start of a directory name. Check for valid prefixes.
      for (kj::StringPtr root: ROOTS) {
        if (filename.slice(i).startsWith(root)) {
          filename = filename.slice(i + root.size());

          // We should keep searching to find the last instance of a root name. `i` is no longer
          // a valid index for `filename` so start the loop over.
          goto retry;
        }
      }
    }
  }

  return filename;
}